

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O2

void __thiscall TextBuffer::reset(TextBuffer *this,Text *new_base_text)

{
  Layer *pLVar1;
  uint32_t uVar2;
  Point PVar3;
  Layer *pLVar4;
  optional<Text> local_60;
  
  pLVar4 = (Layer *)&this->top_layer;
  do {
    pLVar4 = pLVar4->previous_layer;
    if (pLVar4 == (Layer *)0x0) {
      pLVar4 = this->top_layer->previous_layer;
      while (pLVar4 != (Layer *)0x0) {
        pLVar1 = pLVar4->previous_layer;
        Layer::~Layer(pLVar4);
        operator_delete(pLVar4,0xa0);
        pLVar4 = pLVar1;
      }
      PVar3 = Text::extent(new_base_text);
      this->top_layer->extent_ = PVar3;
      uVar2 = Text::size(new_base_text);
      this->top_layer->size_ = uVar2;
      optional<Text>::optional(&local_60,new_base_text);
      optional<Text>::operator=(&this->top_layer->text,&local_60);
      Text::~Text(&local_60.value);
      Patch::clear(&this->top_layer->patch);
      pLVar4 = this->top_layer;
      pLVar4->uses_patch = false;
      this->base_layer = pLVar4;
      pLVar4->previous_layer = (Layer *)0x0;
      return;
    }
  } while (pLVar4->snapshot_count == 0);
  set_text(this,&new_base_text->content);
  flush_changes(this);
  return;
}

Assistant:

void TextBuffer::reset(Text &&new_base_text) {
  bool has_snapshot = false;
  auto layer = top_layer;
  while (layer) {
    if (layer->snapshot_count > 0) {
      has_snapshot = true;
      break;
    }
    layer = layer->previous_layer;
  }

  if (has_snapshot) {
    set_text(move(new_base_text.content));
    flush_changes();
    return;
  }

  layer = top_layer->previous_layer;
  while (layer) {
    Layer *previous_layer = layer->previous_layer;
    delete layer;
    layer = previous_layer;
  }

  top_layer->extent_ = new_base_text.extent();
  top_layer->size_ = new_base_text.size();
  top_layer->text = move(new_base_text);
  top_layer->patch.clear();
  top_layer->uses_patch = false;
  base_layer = top_layer;
  top_layer->previous_layer = nullptr;
}